

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

string * google::protobuf::compiler::python::anon_unknown_0::
         NamePrefixedWithNestedTypes<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *descriptor,string *separator)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  Descriptor *local_30;
  Descriptor *current;
  string *local_20;
  string *separator_local;
  Descriptor *descriptor_local;
  string *name;
  
  current._7_1_ = 0;
  local_20 = separator;
  separator_local = (string *)descriptor;
  descriptor_local = (Descriptor *)__return_storage_ptr__;
  psVar1 = Descriptor::name_abi_cxx11_(descriptor);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  for (local_30 = Descriptor::containing_type((Descriptor *)separator_local);
      local_30 != (Descriptor *)0x0; local_30 = Descriptor::containing_type(local_30)) {
    psVar1 = Descriptor::name_abi_cxx11_(local_30);
    std::operator+(&local_70,psVar1,local_20);
    std::operator+(&local_50,&local_70,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

string NamePrefixedWithNestedTypes(const DescriptorT& descriptor,
                                   const string& separator) {
  string name = descriptor.name();
  for (const Descriptor* current = descriptor.containing_type();
       current != NULL; current = current->containing_type()) {
    name = current->name() + separator + name;
  }
  return name;
}